

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::addGroupFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  int *i_00;
  uint uVar1;
  TestFilter *this_00;
  TestFilter *pTVar2;
  SimpleString local_50;
  undefined1 local_40 [24];
  TestFilter *groupFilter;
  int *i_local;
  char **av_local;
  CommandLineArguments *pCStack_10;
  int ac_local;
  CommandLineArguments *this_local;
  
  groupFilter = (TestFilter *)i;
  i_local = (int *)av;
  av_local._4_4_ = ac;
  pCStack_10 = this;
  this_00 = (TestFilter *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/CommandLineArguments.cpp"
                         ,0x129);
  uVar1 = av_local._4_4_;
  i_00 = i_local;
  pTVar2 = groupFilter;
  SimpleString::SimpleString(&local_50,"-g");
  getParameterField((CommandLineArguments *)local_40,(int)this,(char **)(ulong)uVar1,i_00,
                    &pTVar2->filter_);
  TestFilter::TestFilter(this_00,(SimpleString *)local_40);
  SimpleString::~SimpleString((SimpleString *)local_40);
  SimpleString::~SimpleString(&local_50);
  local_40._16_8_ = this_00;
  pTVar2 = TestFilter::add(this_00,this->groupFilters_);
  this->groupFilters_ = pTVar2;
  return;
}

Assistant:

void CommandLineArguments::addGroupFilter(int ac, const char *const *av, int& i)
{
    TestFilter* groupFilter = new TestFilter(getParameterField(ac, av, i, "-g"));
    groupFilters_ = groupFilter->add(groupFilters_);
}